

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cc
# Opt level: O0

void __thiscall UdpSocket::~UdpSocket(UdpSocket *this)

{
  UdpSocket *this_local;
  
  if (this->_socket != -1) {
    close(this->_socket);
  }
  std::unique_ptr<sockaddr_in,_std::default_delete<sockaddr_in>_>::~unique_ptr(&this->_read_addr);
  std::unique_ptr<fd_set,_std::default_delete<fd_set>_>::~unique_ptr(&this->_readset);
  std::unique_ptr<timeval,_std::default_delete<timeval>_>::~unique_ptr(&this->_read_time);
  return;
}

Assistant:

UdpSocket::~UdpSocket()
{
	if (_socket != INVALID_SOCKET) {
#ifdef _WIN32
		closesocket(_socket);
#else
		close(_socket);
#endif
	}
}